

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

_Bool have_controlling_tty(void)

{
  int iVar1;
  FingerprintType FVar2;
  int *piVar3;
  ulong in_RCX;
  undefined8 extraout_RDX;
  char *pcVar4;
  char **fingerprints;
  char *pcVar5;
  
  fingerprints = (char **)0x0;
  iVar1 = open("/dev/tty",0);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 6) {
      have_controlling_tty_cold_1();
      pcVar4 = " (re-encryptable)";
      if ((in_RCX & 1) == 0) {
        pcVar4 = "";
      }
      pcVar5 = " (encrypted)";
      if ((in_RCX & 2) == 0) {
        pcVar5 = pcVar4;
      }
      FVar2 = ssh2_pick_fingerprint(fingerprints,key_list_fptype ^ SSH_FPTYPE_SHA256);
      iVar1 = printf("%s %s%s\n",fingerprints[FVar2],extraout_RDX,pcVar5);
      return SUB41(iVar1,0);
    }
  }
  else {
    close(iVar1);
  }
  return -1 < iVar1;
}

Assistant:

bool have_controlling_tty(void)
{
    int fd = open("/dev/tty", O_RDONLY);
    if (fd < 0) {
        if (errno != ENXIO) {
            perror("/dev/tty: open");
            exit(1);
        }
        return false;
    } else {
        close(fd);
        return true;
    }
}